

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O0

void __thiscall ON_Linetype::ON_Linetype(ON_Linetype *this,ON_Linetype *src)

{
  ON_LinetypePrivate *this_00;
  ON_Linetype *local_30;
  ON_Linetype *src_local;
  ON_Linetype *this_local;
  
  ON_ModelComponent::ON_ModelComponent
            (&this->super_ON_ModelComponent,LinePattern,&src->super_ON_ModelComponent);
  (this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00b71d58;
  this->m_private = (ON_LinetypePrivate *)0x0;
  this->m_is_set_bits = src->m_is_set_bits;
  this->m_is_locked_bits = src->m_is_locked_bits;
  this->m_cap_style = src->m_cap_style;
  this->m_join_style = src->m_join_style;
  this->m_width = src->m_width;
  this->m_width_units = src->m_width_units;
  this->m_reserved[0] = '\0';
  local_30 = (ON_Linetype *)(this->m_reserved + 1);
  do {
    *(undefined1 *)&(local_30->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object = 0;
    local_30 = (ON_Linetype *)
               ((long)&(local_30->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object + 1);
  } while (local_30 != this + 1);
  this_00 = (ON_LinetypePrivate *)operator_new(0x38);
  ON_LinetypePrivate::ON_LinetypePrivate(this_00,src->m_private);
  this->m_private = this_00;
  return;
}

Assistant:

ON_Linetype::ON_Linetype( const ON_Linetype& src )
  : ON_ModelComponent(ON_ModelComponent::Type::LinePattern,src)
  , m_is_set_bits(src.m_is_set_bits)
  , m_is_locked_bits(src.m_is_locked_bits)
  , m_cap_style(src.m_cap_style)
  , m_join_style(src.m_join_style)
  , m_width(src.m_width)
  , m_width_units(src.m_width_units)
{
  m_private = new ON_LinetypePrivate(*src.m_private);
}